

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O1

Am_Value * __thiscall
Formula_Context::Raise_Get_Exception
          (Formula_Context *this,Am_Value *value,Am_Object_Advanced *param_2,Am_Slot_Key param_3,
          Am_Slot_Flags flags,char *param_5)

{
  Am_Value *pAVar1;
  
  pAVar1 = &Am_Zero_Value;
  if (((flags & 2) == 0) && (pAVar1 = value, (flags & 1) == 0)) {
    this->inited = false;
    Am_Value::operator=(&this->exception,value);
    pAVar1 = &Am_Zero_Value;
  }
  return pAVar1;
}

Assistant:

const Am_Value &
Formula_Context::Raise_Get_Exception(const Am_Value &value,
                                     const Am_Object_Advanced &, Am_Slot_Key,
                                     Am_Slot_Flags flags, const char *)
{
  if (flags & Am_RETURN_ZERO_ON_ERROR_BIT)
    return Am_Zero_Value;
  else if (flags & Am_OK_IF_NOT_THERE)
    return value;
  else {
    inited = false;
    exception = value;
    return Am_Zero_Value;
  }
}